

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O0

RGBAEssenceDescriptor *
get_descriptor_by_type<AS_02::JXS::MXFReader,ASDCP::MXF::RGBAEssenceDescriptor>
          (MXFReader *reader,UL *type_ul)

{
  long *plVar1;
  byte_t *pbVar2;
  RGBAEssenceDescriptor *local_a0;
  Result_t local_88 [104];
  long local_20;
  InterchangeObject *obj;
  UL *type_ul_local;
  MXFReader *reader_local;
  
  local_20 = 0;
  obj = (InterchangeObject *)type_ul;
  type_ul_local = (UL *)reader;
  plVar1 = (long *)(**(code **)(*(long *)reader + 0x10))();
  pbVar2 = Kumu::Identifier<16U>::Value((Identifier<16U> *)obj);
  (**(code **)(*plVar1 + 0xa8))(local_88,plVar1,pbVar2,&local_20);
  Kumu::Result_t::~Result_t(local_88);
  if (local_20 == 0) {
    local_a0 = (RGBAEssenceDescriptor *)0x0;
  }
  else {
    local_a0 = (RGBAEssenceDescriptor *)
               __dynamic_cast(local_20,&ASDCP::MXF::InterchangeObject::typeinfo,
                              &ASDCP::MXF::RGBAEssenceDescriptor::typeinfo,0);
  }
  return local_a0;
}

Assistant:

DescriptorType *get_descriptor_by_type(ReaderType& reader, const UL& type_ul)
{
  InterchangeObject *obj = 0;
  reader.OP1aHeader().GetMDObjectByType(type_ul.Value(), &obj);
  return dynamic_cast<DescriptorType*>(obj);
}